

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiasLayerParams::InternalSwap(BiasLayerParams *this,BiasLayerParams *other)

{
  BiasLayerParams *other_local;
  BiasLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shape_,&other->shape_);
  std::swap<CoreML::Specification::WeightParams*>(&this->bias_,&other->bias_);
  return;
}

Assistant:

void BiasLayerParams::InternalSwap(BiasLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shape_.InternalSwap(&other->shape_);
  swap(bias_, other->bias_);
}